

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

Abc_Obj_t *
Abc_NodeBalance_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld,Vec_Vec_t *vStorage,int Level,
                   int fDuplicate,int fSelective,int fUpdateLevel)

{
  uint *puVar1;
  Abc_Aig_t *pMan;
  Vec_Ptr_t *vSuper;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  void *pvVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  uint uVar8;
  
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xf7,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
  }
  if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xfb,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
  iVar3 = vStorage->nSize;
  if (Level < iVar3) {
    if (Level < 0) goto LAB_00297856;
  }
  else {
    iVar2 = Level + 1;
    if (vStorage->nCap <= Level) {
      if (vStorage->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar2 << 3);
      }
      else {
        ppvVar4 = (void **)realloc(vStorage->pArray,(long)iVar2 << 3);
        iVar3 = vStorage->nSize;
      }
      vStorage->pArray = ppvVar4;
      vStorage->nCap = iVar2;
    }
    if (iVar3 <= Level) {
      lVar7 = (long)iVar3;
      iVar3 = (Level - iVar3) + 1;
      do {
        pvVar5 = calloc(1,0x10);
        vStorage->pArray[lVar7] = pvVar5;
        lVar7 = lVar7 + 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    vStorage->nSize = iVar2;
    if (0x7ffffffe < (uint)Level) goto LAB_00297856;
    puVar1 = (uint *)vStorage->pArray[(uint)Level];
    uVar8 = puVar1[1];
    if (uVar8 == *puVar1) {
      if ((int)uVar8 < 0x10) {
        if (*(void **)(puVar1 + 2) == (void *)0x0) {
          pvVar5 = malloc(0x80);
        }
        else {
          pvVar5 = realloc(*(void **)(puVar1 + 2),0x80);
        }
        *(void **)(puVar1 + 2) = pvVar5;
        *puVar1 = 0x10;
      }
      else {
        if (*(void **)(puVar1 + 2) == (void *)0x0) {
          pvVar5 = malloc((ulong)uVar8 << 4);
        }
        else {
          pvVar5 = realloc(*(void **)(puVar1 + 2),(ulong)uVar8 << 4);
        }
        *(void **)(puVar1 + 2) = pvVar5;
        *puVar1 = uVar8 * 2;
      }
    }
    else {
      pvVar5 = *(void **)(puVar1 + 2);
    }
    uVar8 = puVar1[1];
    puVar1[1] = uVar8 + 1;
    *(undefined8 *)((long)pvVar5 + (long)(int)uVar8 * 8) = 0;
    iVar3 = vStorage->nSize;
  }
  if (iVar3 <= Level) {
LAB_00297856:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  vSuper = (Vec_Ptr_t *)vStorage->pArray[(uint)Level];
  vSuper->nSize = 0;
  iVar3 = Abc_NodeBalanceCone_rec(pNodeOld,vSuper,1,fDuplicate,fSelective);
  if (vSuper->nSize < 2) {
    __assert_fail("vNodes->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x140,"Vec_Ptr_t *Abc_NodeBalanceCone(Abc_Obj_t *, Vec_Vec_t *, int, int, int)");
  }
  lVar7 = 0;
  do {
    puVar1 = (uint *)(((ulong)vSuper->pArray[lVar7] & 0xfffffffffffffffe) + 0x14);
    *puVar1 = *puVar1 & 0xffffffdf;
    lVar7 = lVar7 + 1;
    iVar2 = vSuper->nSize;
  } while (lVar7 < iVar2);
  if (iVar3 == -1) {
    vSuper->nSize = 0;
LAB_002977f6:
    pAVar6 = Abc_AigConst1(pNtkNew);
    (pNodeOld->field_6).pTemp = (Abc_Obj_t *)((ulong)pAVar6 ^ 1);
    return (Abc_Obj_t *)((ulong)pAVar6 ^ 1);
  }
  if (iVar2 == 0) goto LAB_002977f6;
  if (iVar2 < 1) {
LAB_00297720:
    puts("BUG!");
    uVar8 = vSuper->nSize;
    if ((int)uVar8 < 2) goto LAB_002978b3;
  }
  else {
    lVar7 = 0;
    do {
      pAVar6 = Abc_NodeBalance_rec(pNtkNew,(Abc_Obj_t *)
                                           ((ulong)vSuper->pArray[lVar7] & 0xfffffffffffffffe),
                                   vStorage,Level + 1,fDuplicate,fSelective,fUpdateLevel);
      vSuper->pArray[lVar7] = (void *)((ulong)((uint)vSuper->pArray[lVar7] & 1) ^ (ulong)pAVar6);
      lVar7 = lVar7 + 1;
      uVar8 = vSuper->nSize;
    } while (lVar7 < (int)uVar8);
    if ((int)uVar8 < 2) goto LAB_00297720;
  }
  qsort(vSuper->pArray,(ulong)uVar8,8,Abc_NodeCompareLevelsDecrease);
  if (1 < vSuper->nSize) {
    while( true ) {
      if (fUpdateLevel == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = Abc_NodeBalanceFindLeft(vSuper);
      }
      Abc_NodeBalancePermute(pNtkNew,vSuper,iVar3);
      iVar3 = vSuper->nSize;
      if (iVar3 < 1) break;
      uVar8 = iVar3 - 1;
      vSuper->nSize = uVar8;
      if (uVar8 == 0) break;
      pAVar6 = (Abc_Obj_t *)vSuper->pArray[uVar8];
      vSuper->nSize = iVar3 - 2U;
      pAVar6 = Abc_AigAnd(pMan,pAVar6,(Abc_Obj_t *)vSuper->pArray[iVar3 - 2U]);
      Abc_VecObjPushUniqueOrderByLevel(vSuper,pAVar6);
      if (vSuper->nSize < 2) {
        if ((pNodeOld->field_6).pTemp == (void *)0x0) {
          pNodeOld->field_6 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)vSuper->pArray;
          vSuper->nSize = 0;
          return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
        }
        __assert_fail("pNodeOld->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                      ,0x11c,
                      "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                     );
      }
    }
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
  }
LAB_002978b3:
  __assert_fail("vSuper->nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                ,0x10f,
                "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
               );
}

Assistant:

Abc_Obj_t * Abc_NodeBalance_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld, Vec_Vec_t * vStorage, int Level, int fDuplicate, int fSelective, int fUpdateLevel )
{
    Abc_Aig_t * pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
    Abc_Obj_t * pNodeNew, * pNode1, * pNode2;
    Vec_Ptr_t * vSuper;
    int i, LeftBound;
    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    // get the implication supergate
//    Abc_NodeBalanceConeExor( pNodeOld );
    vSuper = Abc_NodeBalanceCone( pNodeOld, vStorage, Level, fDuplicate, fSelective );
    if ( vSuper->nSize == 0 )
    { // it means that the supergate contains two nodes in the opposite polarity
        pNodeOld->pCopy = Abc_ObjNot(Abc_AigConst1(pNtkNew));
        return pNodeOld->pCopy;
    }
    // for each old node, derive the new well-balanced node
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        pNodeNew = Abc_NodeBalance_rec( pNtkNew, Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i]), vStorage, Level + 1, fDuplicate, fSelective, fUpdateLevel );
        vSuper->pArray[i] = Abc_ObjNotCond( pNodeNew, Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]) );
    }
    if ( vSuper->nSize < 2 )
        printf( "BUG!\n" );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Abc_NodeCompareLevelsDecrease );
    // balance the nodes
    assert( vSuper->nSize > 1 );
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Abc_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Abc_NodeBalancePermute( pNtkNew, vSuper, LeftBound );
        // pull out the last two nodes
        pNode1 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        pNode2 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        Abc_VecObjPushUniqueOrderByLevel( vSuper, Abc_AigAnd(pMan, pNode1, pNode2) );
    }
    // make sure the balanced node is not assigned
    assert( pNodeOld->pCopy == NULL );
    // mark the old node with the new node
    pNodeOld->pCopy = (Abc_Obj_t *)vSuper->pArray[0];
    vSuper->nSize = 0;
//    if ( Abc_ObjRegular(pNodeOld->pCopy) == Abc_AigConst1(pNtkNew) )
//        printf( "Constant node\n" );
//    assert( pNodeOld->Level >= Abc_ObjRegular(pNodeOld->pCopy)->Level );
    return pNodeOld->pCopy;
}